

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# solverLines.cpp
# Opt level: O2

vector<Eigen::Matrix<float,_4,_4,_0,_4,_4>,_std::allocator<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>_> *
solver6L<float>(vector<Eigen::Matrix<float,_4,_4,_0,_4,_4>,_std::allocator<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>_>
                *__return_storage_ptr__,
               vector<std::pair<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_Eigen::Matrix<float,_4,_1,_0,_4,_1>_>,_std::allocator<std::pair<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_Eigen::Matrix<float,_4,_1,_0,_4,_1>_>_>_>
               *ptPair,vector<std::pair<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_Eigen::Matrix<float,_4,_1,_0,_4,_1>_>,_std::allocator<std::pair<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_Eigen::Matrix<float,_4,_1,_0,_4,_1>_>_>_>
                       *plPair,
               vector<std::pair<std::pair<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_Eigen::Matrix<float,_4,_1,_0,_4,_1>_>,_std::pair<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_Eigen::Matrix<float,_4,_1,_0,_4,_1>_>_>,_std::allocator<std::pair<std::pair<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_Eigen::Matrix<float,_4,_1,_0,_4,_1>_>,_std::pair<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_Eigen::Matrix<float,_4,_1,_0,_4,_1>_>_>_>_>
               *lPair,vector<std::pair<std::pair<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_Eigen::Matrix<float,_4,_1,_0,_4,_1>_>,_std::pair<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_Eigen::Matrix<float,_4,_1,_0,_4,_1>_>_>,_std::allocator<std::pair<std::pair<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_Eigen::Matrix<float,_4,_1,_0,_4,_1>_>,_std::pair<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_Eigen::Matrix<float,_4,_1,_0,_4,_1>_>_>_>_>
                      *lCPair)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  Scalar *__x;
  Scalar *__y;
  Scalar *pSVar7;
  Scalar *pSVar8;
  Scalar *pSVar9;
  long lVar10;
  long lVar11;
  Type *pTVar12;
  Lhs *pLVar13;
  bool bVar14;
  int c;
  int i;
  long lVar15;
  ulong index;
  bool bVar16;
  byte bVar17;
  RealScalar RVar18;
  Scalar extraout_XMM0_Da;
  float extraout_XMM0_Db;
  Matrix<float,_3,_1,_0,_3,_1> eD2;
  Matrix<float,_3,_1,_0,_3,_1> R61_B;
  Matrix<float,_3,_1,_0,_3,_1> Q62;
  Matrix<float,_3,_1,_0,_3,_1> Q61;
  Matrix<float,_3,_1,_0,_3,_1> R52_B;
  Matrix<float,_3,_1,_0,_3,_1> R51_B;
  Matrix<float,_3,_1,_0,_3,_1> Q52;
  Matrix<float,_3,_1,_0,_3,_1> Q51;
  Matrix<float,_3,_1,_0,_3,_1> R42_B;
  Matrix<float,_3,_1,_0,_3,_1> R41_B;
  Matrix<float,_3,_1,_0,_3,_1> Q42;
  Matrix<float,_3,_1,_0,_3,_1> Q41;
  Matrix<float,_3,_1,_0,_3,_1> R32_B;
  Matrix<float,_3,_1,_0,_3,_1> R31_B;
  Matrix<float,_3,_1,_0,_3,_1> Q32;
  Matrix<float,_3,_1,_0,_3,_1> Q31;
  Matrix<float,_3,_1,_0,_3,_1> R22_B;
  Matrix<float,_3,_1,_0,_3,_1> R21_B;
  Matrix<float,_3,_1,_0,_3,_1> Q21;
  Matrix<float,_3,_1,_0,_3,_1> solution;
  Matrix<float,_3,_1,_0,_3,_1> R62_B;
  Matrix<float,_3,_1,_0,_3,_1> Q22;
  Matrix<float,_3,_1,_0,_3,_1> R12_B;
  Matrix<float,_3,_1,_0,_3,_1> R11_B;
  Matrix<float,_3,_1,_0,_3,_1> Q12;
  Matrix<float,_3,_1,_0,_3,_1> Q11;
  vector<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_Eigen::aligned_allocator<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>_>
  L1vec;
  vector<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_Eigen::aligned_allocator<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>_>
  L2vec;
  Matrix<float,_3,_1,_0,_3,_1> TranslationEstimate;
  Matrix<float,_6,_1,_0,_6,_1> L62;
  Matrix<float,_6,_1,_0,_6,_1> L61;
  Matrix<float,_6,_1,_0,_6,_1> L52;
  Matrix<float,_6,_1,_0,_6,_1> L51;
  Matrix<float,_6,_1,_0,_6,_1> L42;
  Matrix<float,_6,_1,_0,_6,_1> L41;
  Matrix<float,_6,_1,_0,_6,_1> L32;
  Matrix<float,_6,_1,_0,_6,_1> L31;
  Matrix<float,_6,_1,_0,_6,_1> L22;
  Matrix<float,_6,_1,_0,_6,_1> L21;
  Matrix<float,_6,_1,_0,_6,_1> L12;
  Matrix<float,_6,_1,_0,_6,_1> L11;
  Matrix<float,_3,_3,_0,_3,_3> RotationEstimate;
  Matrix<float,_6,_6,_0,_6,_6> L1;
  Matrix<float,_6,_1,_0,_6,_1> k;
  Matrix<float,_6,_6,_0,_6,_6> L2;
  Matrix<float,_4,_4,_0,_4,_4> TransformationEstimate;
  Matrix<float,_6,_3,_0,_6,_3> A;
  Block<Eigen::Matrix<float,_6,_6,_0,_6,_6>,_6,_1,_true> BStack_20f38;
  Block<Eigen::Matrix<float,_6,_6,_0,_6,_6>,_6,_1,_true> BStack_20f08;
  Block<Eigen::Matrix<float,_6,_6,_0,_6,_6>,_6,_1,_true> BStack_20ed8;
  Block<Eigen::Matrix<float,_6,_6,_0,_6,_6>,_6,_1,_true> BStack_20ea8;
  Block<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_1,_1,_false> BStack_20e78;
  Type TStack_20e48;
  Type TStack_20de8;
  Type TStack_20d88;
  Type TStack_20d28;
  Product<Eigen::Product<Eigen::Transpose<Eigen::Block<Eigen::Block<Eigen::Matrix<float,_6,_6,_0,_6,_6>,_6,_1,_true>,__1,_1,_false>_>,_Eigen::Matrix<float,_3,_3,_0,_3,_3>,_0>,_Eigen::Block<Eigen::Block<Eigen::Matrix<float,_6,_6,_0,_6,_6>,_6,_1,_true>,__1,_1,_false>,_0>
  PStack_20cc8;
  Product<Eigen::Transpose<Eigen::Block<Eigen::Block<Eigen::Matrix<float,_6,_6,_0,_6,_6>,_6,_1,_true>,__1,_1,_false>_>,_Eigen::Matrix<float,_3,_3,_0,_3,_3>,_0>
  PStack_20c00;
  Product<Eigen::Transpose<Eigen::Block<Eigen::Block<Eigen::Matrix<float,_6,_6,_0,_6,_6>,_6,_1,_true>,__1,_1,_false>_>,_Eigen::Matrix<float,_3,_3,_0,_3,_3>,_0>
  PStack_20b98;
  Type aTStack_20b30 [2];
  undefined1 auStack_20a68 [208];
  undefined1 auStack_20998 [424];
  Lhs LStack_207f0;
  Lhs LStack_20790;
  Product<Eigen::Product<Eigen::Transpose<Eigen::Block<Eigen::Block<Eigen::Matrix<float,_6,_6,_0,_6,_6>,_6,_1,_true>,__1,_1,_false>_>,_Eigen::Matrix<float,_3,_3,_0,_3,_3>,_0>,_Eigen::Block<Eigen::Block<Eigen::Matrix<float,_6,_6,_0,_6,_6>,_6,_1,_true>,__1,_1,_false>,_0>
  PStack_20730;
  EigenSolver<Eigen::Matrix<float,_64,_64,_0,_64,_64>_> Eig;
  Matrix<float,_64,_64,_0,_64,_64> Action;
  Matrix<std::complex<float>,_64,_64,_0,_64,_64> EV;
  
  bVar17 = 0;
  (__return_storage_ptr__->
  super__Vector_base<Eigen::Matrix<float,_4,_4,_0,_4,_4>,_std::allocator<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>_>
  )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<Eigen::Matrix<float,_4,_4,_0,_4,_4>,_std::allocator<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>_>
  )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<Eigen::Matrix<float,_4,_4,_0,_4,_4>,_std::allocator<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>_>
  )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  Eigen::DenseBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>_>::head<int>
            ((Type *)&Eig,*(DenseBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>_> **)lPair,3);
  Eigen::internal::
  call_assignment<Eigen::Matrix<float,3,1,0,3,1>,Eigen::Block<Eigen::Matrix<float,4,1,0,4,1>,_1,1,false>>
            (&Q11,(Block<Eigen::Matrix<float,_4,_1,_0,_4,_1>,__1,_1,_false> *)&Eig);
  Eigen::DenseBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>_>::head<int>
            ((Type *)&Eig,(DenseBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>_> *)(*(long *)lPair + 0x10)
             ,3);
  Eigen::internal::
  call_assignment<Eigen::Matrix<float,3,1,0,3,1>,Eigen::Block<Eigen::Matrix<float,4,1,0,4,1>,_1,1,false>>
            (&Q12,(Block<Eigen::Matrix<float,_4,_1,_0,_4,_1>,__1,_1,_false> *)&Eig);
  Eigen::DenseBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>_>::head<int>
            ((Type *)&Eig,(DenseBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>_> *)(*(long *)lPair + 0x20)
             ,3);
  Eigen::internal::
  call_assignment<Eigen::Matrix<float,3,1,0,3,1>,Eigen::Block<Eigen::Matrix<float,4,1,0,4,1>,_1,1,false>>
            (&R11_B,(Block<Eigen::Matrix<float,_4,_1,_0,_4,_1>,__1,_1,_false> *)&Eig);
  Eigen::DenseBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>_>::head<int>
            ((Type *)&Eig,(DenseBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>_> *)(*(long *)lPair + 0x30)
             ,3);
  Eigen::internal::
  call_assignment<Eigen::Matrix<float,3,1,0,3,1>,Eigen::Block<Eigen::Matrix<float,4,1,0,4,1>,_1,1,false>>
            (&R12_B,(Block<Eigen::Matrix<float,_4,_1,_0,_4,_1>,__1,_1,_false> *)&Eig);
  Eigen::DenseBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>_>::head<int>
            ((Type *)&Eig,(DenseBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>_> *)(*(long *)lPair + 0x40)
             ,3);
  Eigen::internal::
  call_assignment<Eigen::Matrix<float,3,1,0,3,1>,Eigen::Block<Eigen::Matrix<float,4,1,0,4,1>,_1,1,false>>
            (&Q21,(Block<Eigen::Matrix<float,_4,_1,_0,_4,_1>,__1,_1,_false> *)&Eig);
  Eigen::DenseBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>_>::head<int>
            ((Type *)&Eig,(DenseBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>_> *)(*(long *)lPair + 0x50)
             ,3);
  Eigen::internal::
  call_assignment<Eigen::Matrix<float,3,1,0,3,1>,Eigen::Block<Eigen::Matrix<float,4,1,0,4,1>,_1,1,false>>
            (&Q22,(Block<Eigen::Matrix<float,_4,_1,_0,_4,_1>,__1,_1,_false> *)&Eig);
  Eigen::DenseBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>_>::head<int>
            ((Type *)&Eig,(DenseBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>_> *)(*(long *)lPair + 0x60)
             ,3);
  Eigen::internal::
  call_assignment<Eigen::Matrix<float,3,1,0,3,1>,Eigen::Block<Eigen::Matrix<float,4,1,0,4,1>,_1,1,false>>
            (&R21_B,(Block<Eigen::Matrix<float,_4,_1,_0,_4,_1>,__1,_1,_false> *)&Eig);
  Eigen::DenseBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>_>::head<int>
            ((Type *)&Eig,(DenseBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>_> *)(*(long *)lPair + 0x70)
             ,3);
  Eigen::internal::
  call_assignment<Eigen::Matrix<float,3,1,0,3,1>,Eigen::Block<Eigen::Matrix<float,4,1,0,4,1>,_1,1,false>>
            (&R22_B,(Block<Eigen::Matrix<float,_4,_1,_0,_4,_1>,__1,_1,_false> *)&Eig);
  Eigen::DenseBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>_>::head<int>
            ((Type *)&Eig,(DenseBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>_> *)(*(long *)lPair + 0x80)
             ,3);
  Eigen::internal::
  call_assignment<Eigen::Matrix<float,3,1,0,3,1>,Eigen::Block<Eigen::Matrix<float,4,1,0,4,1>,_1,1,false>>
            (&Q31,(Block<Eigen::Matrix<float,_4,_1,_0,_4,_1>,__1,_1,_false> *)&Eig);
  Eigen::DenseBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>_>::head<int>
            ((Type *)&Eig,(DenseBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>_> *)(*(long *)lPair + 0x90)
             ,3);
  Eigen::internal::
  call_assignment<Eigen::Matrix<float,3,1,0,3,1>,Eigen::Block<Eigen::Matrix<float,4,1,0,4,1>,_1,1,false>>
            (&Q32,(Block<Eigen::Matrix<float,_4,_1,_0,_4,_1>,__1,_1,_false> *)&Eig);
  Eigen::DenseBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>_>::head<int>
            ((Type *)&Eig,(DenseBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>_> *)(*(long *)lPair + 0xa0)
             ,3);
  Eigen::internal::
  call_assignment<Eigen::Matrix<float,3,1,0,3,1>,Eigen::Block<Eigen::Matrix<float,4,1,0,4,1>,_1,1,false>>
            (&R31_B,(Block<Eigen::Matrix<float,_4,_1,_0,_4,_1>,__1,_1,_false> *)&Eig);
  Eigen::DenseBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>_>::head<int>
            ((Type *)&Eig,(DenseBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>_> *)(*(long *)lPair + 0xb0)
             ,3);
  Eigen::internal::
  call_assignment<Eigen::Matrix<float,3,1,0,3,1>,Eigen::Block<Eigen::Matrix<float,4,1,0,4,1>,_1,1,false>>
            (&R32_B,(Block<Eigen::Matrix<float,_4,_1,_0,_4,_1>,__1,_1,_false> *)&Eig);
  Eigen::DenseBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>_>::head<int>
            ((Type *)&Eig,(DenseBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>_> *)(*(long *)lPair + 0xc0)
             ,3);
  Eigen::internal::
  call_assignment<Eigen::Matrix<float,3,1,0,3,1>,Eigen::Block<Eigen::Matrix<float,4,1,0,4,1>,_1,1,false>>
            (&Q41,(Block<Eigen::Matrix<float,_4,_1,_0,_4,_1>,__1,_1,_false> *)&Eig);
  Eigen::DenseBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>_>::head<int>
            ((Type *)&Eig,(DenseBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>_> *)(*(long *)lPair + 0xd0)
             ,3);
  Eigen::internal::
  call_assignment<Eigen::Matrix<float,3,1,0,3,1>,Eigen::Block<Eigen::Matrix<float,4,1,0,4,1>,_1,1,false>>
            (&Q42,(Block<Eigen::Matrix<float,_4,_1,_0,_4,_1>,__1,_1,_false> *)&Eig);
  Eigen::DenseBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>_>::head<int>
            ((Type *)&Eig,(DenseBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>_> *)(*(long *)lPair + 0xe0)
             ,3);
  Eigen::internal::
  call_assignment<Eigen::Matrix<float,3,1,0,3,1>,Eigen::Block<Eigen::Matrix<float,4,1,0,4,1>,_1,1,false>>
            (&R41_B,(Block<Eigen::Matrix<float,_4,_1,_0,_4,_1>,__1,_1,_false> *)&Eig);
  Eigen::DenseBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>_>::head<int>
            ((Type *)&Eig,(DenseBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>_> *)(*(long *)lPair + 0xf0)
             ,3);
  Eigen::internal::
  call_assignment<Eigen::Matrix<float,3,1,0,3,1>,Eigen::Block<Eigen::Matrix<float,4,1,0,4,1>,_1,1,false>>
            (&R42_B,(Block<Eigen::Matrix<float,_4,_1,_0,_4,_1>,__1,_1,_false> *)&Eig);
  Eigen::DenseBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>_>::head<int>
            ((Type *)&Eig,
             (DenseBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>_> *)(*(long *)lPair + 0x100),3);
  Eigen::internal::
  call_assignment<Eigen::Matrix<float,3,1,0,3,1>,Eigen::Block<Eigen::Matrix<float,4,1,0,4,1>,_1,1,false>>
            (&Q51,(Block<Eigen::Matrix<float,_4,_1,_0,_4,_1>,__1,_1,_false> *)&Eig);
  Eigen::DenseBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>_>::head<int>
            ((Type *)&Eig,
             (DenseBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>_> *)(*(long *)lPair + 0x110),3);
  Eigen::internal::
  call_assignment<Eigen::Matrix<float,3,1,0,3,1>,Eigen::Block<Eigen::Matrix<float,4,1,0,4,1>,_1,1,false>>
            (&Q52,(Block<Eigen::Matrix<float,_4,_1,_0,_4,_1>,__1,_1,_false> *)&Eig);
  Eigen::DenseBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>_>::head<int>
            ((Type *)&Eig,
             (DenseBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>_> *)(*(long *)lPair + 0x120),3);
  Eigen::internal::
  call_assignment<Eigen::Matrix<float,3,1,0,3,1>,Eigen::Block<Eigen::Matrix<float,4,1,0,4,1>,_1,1,false>>
            (&R51_B,(Block<Eigen::Matrix<float,_4,_1,_0,_4,_1>,__1,_1,_false> *)&Eig);
  Eigen::DenseBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>_>::head<int>
            ((Type *)&Eig,
             (DenseBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>_> *)(*(long *)lPair + 0x130),3);
  Eigen::internal::
  call_assignment<Eigen::Matrix<float,3,1,0,3,1>,Eigen::Block<Eigen::Matrix<float,4,1,0,4,1>,_1,1,false>>
            (&R52_B,(Block<Eigen::Matrix<float,_4,_1,_0,_4,_1>,__1,_1,_false> *)&Eig);
  Eigen::DenseBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>_>::head<int>
            ((Type *)&Eig,
             (DenseBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>_> *)(*(long *)lPair + 0x140),3);
  Eigen::internal::
  call_assignment<Eigen::Matrix<float,3,1,0,3,1>,Eigen::Block<Eigen::Matrix<float,4,1,0,4,1>,_1,1,false>>
            (&Q61,(Block<Eigen::Matrix<float,_4,_1,_0,_4,_1>,__1,_1,_false> *)&Eig);
  Eigen::DenseBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>_>::head<int>
            ((Type *)&Eig,
             (DenseBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>_> *)(*(long *)lPair + 0x150),3);
  Eigen::internal::
  call_assignment<Eigen::Matrix<float,3,1,0,3,1>,Eigen::Block<Eigen::Matrix<float,4,1,0,4,1>,_1,1,false>>
            (&Q62,(Block<Eigen::Matrix<float,_4,_1,_0,_4,_1>,__1,_1,_false> *)&Eig);
  Eigen::DenseBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>_>::head<int>
            ((Type *)&Eig,
             (DenseBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>_> *)(*(long *)lPair + 0x160),3);
  Eigen::internal::
  call_assignment<Eigen::Matrix<float,3,1,0,3,1>,Eigen::Block<Eigen::Matrix<float,4,1,0,4,1>,_1,1,false>>
            (&R61_B,(Block<Eigen::Matrix<float,_4,_1,_0,_4,_1>,__1,_1,_false> *)&Eig);
  Eigen::DenseBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>_>::head<int>
            ((Type *)&Eig,
             (DenseBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>_> *)(*(long *)lPair + 0x170),3);
  Eigen::internal::
  call_assignment<Eigen::Matrix<float,3,1,0,3,1>,Eigen::Block<Eigen::Matrix<float,4,1,0,4,1>,_1,1,false>>
            (&R62_B,(Block<Eigen::Matrix<float,_4,_1,_0,_4,_1>,__1,_1,_false> *)&Eig);
  EV.super_PlainObjectBase<Eigen::Matrix<std::complex<float>,_64,_64,_0,_64,_64>_>.m_storage.m_data.
  array[0]._M_value = (_ComplexT)&Q12;
  EV.super_PlainObjectBase<Eigen::Matrix<std::complex<float>,_64,_64,_0,_64,_64>_>.m_storage.m_data.
  array[1]._M_value = (_ComplexT)&Q11;
  Eigen::CommaInitializer<Eigen::Matrix<float,6,1,0,6,1>>::
  CommaInitializer<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<float,float>,Eigen::Matrix<float,3,1,0,3,1>const,Eigen::Matrix<float,3,1,0,3,1>const>>
            ((CommaInitializer<Eigen::Matrix<float,6,1,0,6,1>> *)&Eig,&L11,
             (DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<float,_float>,_const_Eigen::Matrix<float,_3,_1,_0,_3,_1>,_const_Eigen::Matrix<float,_3,_1,_0,_3,_1>_>_>
              *)&EV);
  Action.super_PlainObjectBase<Eigen::Matrix<float,_64,_64,_0,_64,_64>_>.m_storage.m_data.array[2] =
       Q11.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[0] *
       Q12.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[1] -
       Q12.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[0] *
       Q11.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[1];
  Action.super_PlainObjectBase<Eigen::Matrix<float,_64,_64,_0,_64,_64>_>.m_storage.m_data.array[1] =
       Q12.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[0] *
       Q11.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[2] -
       Q11.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[0] *
       Q12.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[2];
  Action.super_PlainObjectBase<Eigen::Matrix<float,_64,_64,_0,_64,_64>_>.m_storage.m_data.array[0] =
       Q12.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[2] *
       Q11.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[1] -
       Q11.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[2] *
       Q12.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[1];
  Eigen::CommaInitializer<Eigen::Matrix<float,6,1,0,6,1>>::operator_
            ((CommaInitializer<Eigen::Matrix<float,6,1,0,6,1>> *)&Eig,
             (DenseBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_> *)&Action);
  Eigen::CommaInitializer<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>::finished
            ((CommaInitializer<Eigen::Matrix<float,_6,_1,_0,_6,_1>_> *)&Eig);
  Eigen::DenseBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>::head<int>
            ((Type *)&Eig,(DenseBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_> *)&L11,3);
  RVar18 = Eigen::MatrixBase<Eigen::Block<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_-1,_1,_false>_>::norm
                     ((MatrixBase<Eigen::Block<Eigen::Matrix<float,_6,_1,_0,_6,_1>,__1,_1,_false>_>
                       *)&Eig);
  EV.super_PlainObjectBase<Eigen::Matrix<std::complex<float>,_64,_64,_0,_64,_64>_>.m_storage.m_data.
  array[0]._M_value._0_4_ = RVar18;
  Eigen::DenseBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>::operator/=
            ((DenseBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_> *)&L11,(Scalar *)&EV);
  EV.super_PlainObjectBase<Eigen::Matrix<std::complex<float>,_64,_64,_0,_64,_64>_>.m_storage.m_data.
  array[0]._M_value = (_ComplexT)&R12_B;
  EV.super_PlainObjectBase<Eigen::Matrix<std::complex<float>,_64,_64,_0,_64,_64>_>.m_storage.m_data.
  array[1]._M_value = (_ComplexT)&R11_B;
  Eigen::CommaInitializer<Eigen::Matrix<float,6,1,0,6,1>>::
  CommaInitializer<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<float,float>,Eigen::Matrix<float,3,1,0,3,1>const,Eigen::Matrix<float,3,1,0,3,1>const>>
            ((CommaInitializer<Eigen::Matrix<float,6,1,0,6,1>> *)&Eig,&L12,
             (DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<float,_float>,_const_Eigen::Matrix<float,_3,_1,_0,_3,_1>,_const_Eigen::Matrix<float,_3,_1,_0,_3,_1>_>_>
              *)&EV);
  Action.super_PlainObjectBase<Eigen::Matrix<float,_64,_64,_0,_64,_64>_>.m_storage.m_data.array[2] =
       R11_B.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[0] *
       R12_B.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[1] -
       R12_B.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[0] *
       R11_B.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[1];
  Action.super_PlainObjectBase<Eigen::Matrix<float,_64,_64,_0,_64,_64>_>.m_storage.m_data.array[1] =
       R12_B.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[0] *
       R11_B.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[2] -
       R11_B.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[0] *
       R12_B.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[2];
  Action.super_PlainObjectBase<Eigen::Matrix<float,_64,_64,_0,_64,_64>_>.m_storage.m_data.array[0] =
       R12_B.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[2] *
       R11_B.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[1] -
       R11_B.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[2] *
       R12_B.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[1];
  Eigen::CommaInitializer<Eigen::Matrix<float,6,1,0,6,1>>::operator_
            ((CommaInitializer<Eigen::Matrix<float,6,1,0,6,1>> *)&Eig,
             (DenseBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_> *)&Action);
  Eigen::CommaInitializer<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>::finished
            ((CommaInitializer<Eigen::Matrix<float,_6,_1,_0,_6,_1>_> *)&Eig);
  Eigen::DenseBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>::head<int>
            ((Type *)&Eig,(DenseBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_> *)&L12,3);
  RVar18 = Eigen::MatrixBase<Eigen::Block<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_-1,_1,_false>_>::norm
                     ((MatrixBase<Eigen::Block<Eigen::Matrix<float,_6,_1,_0,_6,_1>,__1,_1,_false>_>
                       *)&Eig);
  EV.super_PlainObjectBase<Eigen::Matrix<std::complex<float>,_64,_64,_0,_64,_64>_>.m_storage.m_data.
  array[0]._M_value._0_4_ = RVar18;
  Eigen::DenseBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>::operator/=
            ((DenseBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_> *)&L12,(Scalar *)&EV);
  EV.super_PlainObjectBase<Eigen::Matrix<std::complex<float>,_64,_64,_0,_64,_64>_>.m_storage.m_data.
  array[1]._M_value = (_ComplexT)&Q21;
  EV.super_PlainObjectBase<Eigen::Matrix<std::complex<float>,_64,_64,_0,_64,_64>_>.m_storage.m_data.
  array[0]._M_value = (_ComplexT)&Q22;
  Eigen::CommaInitializer<Eigen::Matrix<float,6,1,0,6,1>>::
  CommaInitializer<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<float,float>,Eigen::Matrix<float,3,1,0,3,1>const,Eigen::Matrix<float,3,1,0,3,1>const>>
            ((CommaInitializer<Eigen::Matrix<float,6,1,0,6,1>> *)&Eig,&L21,
             (DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<float,_float>,_const_Eigen::Matrix<float,_3,_1,_0,_3,_1>,_const_Eigen::Matrix<float,_3,_1,_0,_3,_1>_>_>
              *)&EV);
  Action.super_PlainObjectBase<Eigen::Matrix<float,_64,_64,_0,_64,_64>_>.m_storage.m_data.array[2] =
       Q21.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[0] *
       Q22.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[1] -
       Q22.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[0] *
       Q21.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[1];
  Action.super_PlainObjectBase<Eigen::Matrix<float,_64,_64,_0,_64,_64>_>.m_storage.m_data.array[1] =
       Q22.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[0] *
       Q21.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[2] -
       Q21.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[0] *
       Q22.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[2];
  Action.super_PlainObjectBase<Eigen::Matrix<float,_64,_64,_0,_64,_64>_>.m_storage.m_data.array[0] =
       Q22.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[2] *
       Q21.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[1] -
       Q21.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[2] *
       Q22.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[1];
  Eigen::CommaInitializer<Eigen::Matrix<float,6,1,0,6,1>>::operator_
            ((CommaInitializer<Eigen::Matrix<float,6,1,0,6,1>> *)&Eig,
             (DenseBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_> *)&Action);
  Eigen::CommaInitializer<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>::finished
            ((CommaInitializer<Eigen::Matrix<float,_6,_1,_0,_6,_1>_> *)&Eig);
  Eigen::DenseBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>::head<int>
            ((Type *)&Eig,(DenseBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_> *)&L21,3);
  RVar18 = Eigen::MatrixBase<Eigen::Block<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_-1,_1,_false>_>::norm
                     ((MatrixBase<Eigen::Block<Eigen::Matrix<float,_6,_1,_0,_6,_1>,__1,_1,_false>_>
                       *)&Eig);
  EV.super_PlainObjectBase<Eigen::Matrix<std::complex<float>,_64,_64,_0,_64,_64>_>.m_storage.m_data.
  array[0]._M_value._0_4_ = RVar18;
  Eigen::DenseBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>::operator/=
            ((DenseBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_> *)&L21,(Scalar *)&EV);
  EV.super_PlainObjectBase<Eigen::Matrix<std::complex<float>,_64,_64,_0,_64,_64>_>.m_storage.m_data.
  array[0]._M_value = (_ComplexT)&R22_B;
  EV.super_PlainObjectBase<Eigen::Matrix<std::complex<float>,_64,_64,_0,_64,_64>_>.m_storage.m_data.
  array[1]._M_value = (_ComplexT)&R21_B;
  Eigen::CommaInitializer<Eigen::Matrix<float,6,1,0,6,1>>::
  CommaInitializer<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<float,float>,Eigen::Matrix<float,3,1,0,3,1>const,Eigen::Matrix<float,3,1,0,3,1>const>>
            ((CommaInitializer<Eigen::Matrix<float,6,1,0,6,1>> *)&Eig,&L22,
             (DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<float,_float>,_const_Eigen::Matrix<float,_3,_1,_0,_3,_1>,_const_Eigen::Matrix<float,_3,_1,_0,_3,_1>_>_>
              *)&EV);
  Action.super_PlainObjectBase<Eigen::Matrix<float,_64,_64,_0,_64,_64>_>.m_storage.m_data.array[2] =
       R21_B.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[0] *
       R22_B.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[1] -
       R22_B.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[0] *
       R21_B.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[1];
  Action.super_PlainObjectBase<Eigen::Matrix<float,_64,_64,_0,_64,_64>_>.m_storage.m_data.array[1] =
       R22_B.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[0] *
       R21_B.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[2] -
       R21_B.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[0] *
       R22_B.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[2];
  Action.super_PlainObjectBase<Eigen::Matrix<float,_64,_64,_0,_64,_64>_>.m_storage.m_data.array[0] =
       R22_B.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[2] *
       R21_B.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[1] -
       R21_B.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[2] *
       R22_B.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[1];
  Eigen::CommaInitializer<Eigen::Matrix<float,6,1,0,6,1>>::operator_
            ((CommaInitializer<Eigen::Matrix<float,6,1,0,6,1>> *)&Eig,
             (DenseBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_> *)&Action);
  Eigen::CommaInitializer<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>::finished
            ((CommaInitializer<Eigen::Matrix<float,_6,_1,_0,_6,_1>_> *)&Eig);
  Eigen::DenseBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>::head<int>
            ((Type *)&Eig,(DenseBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_> *)&L22,3);
  RVar18 = Eigen::MatrixBase<Eigen::Block<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_-1,_1,_false>_>::norm
                     ((MatrixBase<Eigen::Block<Eigen::Matrix<float,_6,_1,_0,_6,_1>,__1,_1,_false>_>
                       *)&Eig);
  EV.super_PlainObjectBase<Eigen::Matrix<std::complex<float>,_64,_64,_0,_64,_64>_>.m_storage.m_data.
  array[0]._M_value._0_4_ = RVar18;
  Eigen::DenseBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>::operator/=
            ((DenseBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_> *)&L22,(Scalar *)&EV);
  EV.super_PlainObjectBase<Eigen::Matrix<std::complex<float>,_64,_64,_0,_64,_64>_>.m_storage.m_data.
  array[0]._M_value = (_ComplexT)&Q32;
  EV.super_PlainObjectBase<Eigen::Matrix<std::complex<float>,_64,_64,_0,_64,_64>_>.m_storage.m_data.
  array[1]._M_value = (_ComplexT)&Q31;
  Eigen::CommaInitializer<Eigen::Matrix<float,6,1,0,6,1>>::
  CommaInitializer<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<float,float>,Eigen::Matrix<float,3,1,0,3,1>const,Eigen::Matrix<float,3,1,0,3,1>const>>
            ((CommaInitializer<Eigen::Matrix<float,6,1,0,6,1>> *)&Eig,&L31,
             (DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<float,_float>,_const_Eigen::Matrix<float,_3,_1,_0,_3,_1>,_const_Eigen::Matrix<float,_3,_1,_0,_3,_1>_>_>
              *)&EV);
  Action.super_PlainObjectBase<Eigen::Matrix<float,_64,_64,_0,_64,_64>_>.m_storage.m_data.array[2] =
       Q31.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[0] *
       Q32.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[1] -
       Q32.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[0] *
       Q31.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[1];
  Action.super_PlainObjectBase<Eigen::Matrix<float,_64,_64,_0,_64,_64>_>.m_storage.m_data.array[1] =
       Q32.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[0] *
       Q31.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[2] -
       Q31.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[0] *
       Q32.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[2];
  Action.super_PlainObjectBase<Eigen::Matrix<float,_64,_64,_0,_64,_64>_>.m_storage.m_data.array[0] =
       Q32.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[2] *
       Q31.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[1] -
       Q31.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[2] *
       Q32.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[1];
  Eigen::CommaInitializer<Eigen::Matrix<float,6,1,0,6,1>>::operator_
            ((CommaInitializer<Eigen::Matrix<float,6,1,0,6,1>> *)&Eig,
             (DenseBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_> *)&Action);
  Eigen::CommaInitializer<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>::finished
            ((CommaInitializer<Eigen::Matrix<float,_6,_1,_0,_6,_1>_> *)&Eig);
  Eigen::DenseBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>::head<int>
            ((Type *)&Eig,(DenseBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_> *)&L31,3);
  RVar18 = Eigen::MatrixBase<Eigen::Block<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_-1,_1,_false>_>::norm
                     ((MatrixBase<Eigen::Block<Eigen::Matrix<float,_6,_1,_0,_6,_1>,__1,_1,_false>_>
                       *)&Eig);
  EV.super_PlainObjectBase<Eigen::Matrix<std::complex<float>,_64,_64,_0,_64,_64>_>.m_storage.m_data.
  array[0]._M_value._0_4_ = RVar18;
  Eigen::DenseBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>::operator/=
            ((DenseBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_> *)&L31,(Scalar *)&EV);
  EV.super_PlainObjectBase<Eigen::Matrix<std::complex<float>,_64,_64,_0,_64,_64>_>.m_storage.m_data.
  array[0]._M_value = (_ComplexT)&R32_B;
  EV.super_PlainObjectBase<Eigen::Matrix<std::complex<float>,_64,_64,_0,_64,_64>_>.m_storage.m_data.
  array[1]._M_value = (_ComplexT)&R31_B;
  Eigen::CommaInitializer<Eigen::Matrix<float,6,1,0,6,1>>::
  CommaInitializer<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<float,float>,Eigen::Matrix<float,3,1,0,3,1>const,Eigen::Matrix<float,3,1,0,3,1>const>>
            ((CommaInitializer<Eigen::Matrix<float,6,1,0,6,1>> *)&Eig,&L32,
             (DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<float,_float>,_const_Eigen::Matrix<float,_3,_1,_0,_3,_1>,_const_Eigen::Matrix<float,_3,_1,_0,_3,_1>_>_>
              *)&EV);
  Action.super_PlainObjectBase<Eigen::Matrix<float,_64,_64,_0,_64,_64>_>.m_storage.m_data.array[2] =
       R31_B.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[0] *
       R32_B.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[1] -
       R32_B.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[0] *
       R31_B.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[1];
  Action.super_PlainObjectBase<Eigen::Matrix<float,_64,_64,_0,_64,_64>_>.m_storage.m_data.array[1] =
       R32_B.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[0] *
       R31_B.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[2] -
       R31_B.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[0] *
       R32_B.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[2];
  Action.super_PlainObjectBase<Eigen::Matrix<float,_64,_64,_0,_64,_64>_>.m_storage.m_data.array[0] =
       R32_B.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[2] *
       R31_B.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[1] -
       R31_B.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[2] *
       R32_B.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[1];
  Eigen::CommaInitializer<Eigen::Matrix<float,6,1,0,6,1>>::operator_
            ((CommaInitializer<Eigen::Matrix<float,6,1,0,6,1>> *)&Eig,
             (DenseBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_> *)&Action);
  Eigen::CommaInitializer<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>::finished
            ((CommaInitializer<Eigen::Matrix<float,_6,_1,_0,_6,_1>_> *)&Eig);
  Eigen::DenseBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>::head<int>
            ((Type *)&Eig,(DenseBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_> *)&L32,3);
  RVar18 = Eigen::MatrixBase<Eigen::Block<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_-1,_1,_false>_>::norm
                     ((MatrixBase<Eigen::Block<Eigen::Matrix<float,_6,_1,_0,_6,_1>,__1,_1,_false>_>
                       *)&Eig);
  EV.super_PlainObjectBase<Eigen::Matrix<std::complex<float>,_64,_64,_0,_64,_64>_>.m_storage.m_data.
  array[0]._M_value._0_4_ = RVar18;
  Eigen::DenseBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>::operator/=
            ((DenseBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_> *)&L32,(Scalar *)&EV);
  EV.super_PlainObjectBase<Eigen::Matrix<std::complex<float>,_64,_64,_0,_64,_64>_>.m_storage.m_data.
  array[0]._M_value = (_ComplexT)&Q42;
  EV.super_PlainObjectBase<Eigen::Matrix<std::complex<float>,_64,_64,_0,_64,_64>_>.m_storage.m_data.
  array[1]._M_value = (_ComplexT)&Q41;
  Eigen::CommaInitializer<Eigen::Matrix<float,6,1,0,6,1>>::
  CommaInitializer<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<float,float>,Eigen::Matrix<float,3,1,0,3,1>const,Eigen::Matrix<float,3,1,0,3,1>const>>
            ((CommaInitializer<Eigen::Matrix<float,6,1,0,6,1>> *)&Eig,&L41,
             (DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<float,_float>,_const_Eigen::Matrix<float,_3,_1,_0,_3,_1>,_const_Eigen::Matrix<float,_3,_1,_0,_3,_1>_>_>
              *)&EV);
  Action.super_PlainObjectBase<Eigen::Matrix<float,_64,_64,_0,_64,_64>_>.m_storage.m_data.array[2] =
       Q41.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[0] *
       Q42.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[1] -
       Q42.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[0] *
       Q41.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[1];
  Action.super_PlainObjectBase<Eigen::Matrix<float,_64,_64,_0,_64,_64>_>.m_storage.m_data.array[1] =
       Q42.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[0] *
       Q41.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[2] -
       Q41.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[0] *
       Q42.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[2];
  Action.super_PlainObjectBase<Eigen::Matrix<float,_64,_64,_0,_64,_64>_>.m_storage.m_data.array[0] =
       Q42.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[2] *
       Q41.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[1] -
       Q41.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[2] *
       Q42.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[1];
  Eigen::CommaInitializer<Eigen::Matrix<float,6,1,0,6,1>>::operator_
            ((CommaInitializer<Eigen::Matrix<float,6,1,0,6,1>> *)&Eig,
             (DenseBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_> *)&Action);
  Eigen::CommaInitializer<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>::finished
            ((CommaInitializer<Eigen::Matrix<float,_6,_1,_0,_6,_1>_> *)&Eig);
  Eigen::DenseBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>::head<int>
            ((Type *)&Eig,(DenseBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_> *)&L41,3);
  RVar18 = Eigen::MatrixBase<Eigen::Block<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_-1,_1,_false>_>::norm
                     ((MatrixBase<Eigen::Block<Eigen::Matrix<float,_6,_1,_0,_6,_1>,__1,_1,_false>_>
                       *)&Eig);
  EV.super_PlainObjectBase<Eigen::Matrix<std::complex<float>,_64,_64,_0,_64,_64>_>.m_storage.m_data.
  array[0]._M_value._0_4_ = RVar18;
  Eigen::DenseBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>::operator/=
            ((DenseBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_> *)&L41,(Scalar *)&EV);
  EV.super_PlainObjectBase<Eigen::Matrix<std::complex<float>,_64,_64,_0,_64,_64>_>.m_storage.m_data.
  array[0]._M_value = (_ComplexT)&R42_B;
  EV.super_PlainObjectBase<Eigen::Matrix<std::complex<float>,_64,_64,_0,_64,_64>_>.m_storage.m_data.
  array[1]._M_value = (_ComplexT)&R41_B;
  Eigen::CommaInitializer<Eigen::Matrix<float,6,1,0,6,1>>::
  CommaInitializer<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<float,float>,Eigen::Matrix<float,3,1,0,3,1>const,Eigen::Matrix<float,3,1,0,3,1>const>>
            ((CommaInitializer<Eigen::Matrix<float,6,1,0,6,1>> *)&Eig,&L42,
             (DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<float,_float>,_const_Eigen::Matrix<float,_3,_1,_0,_3,_1>,_const_Eigen::Matrix<float,_3,_1,_0,_3,_1>_>_>
              *)&EV);
  Action.super_PlainObjectBase<Eigen::Matrix<float,_64,_64,_0,_64,_64>_>.m_storage.m_data.array[2] =
       R41_B.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[0] *
       R42_B.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[1] -
       R42_B.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[0] *
       R41_B.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[1];
  Action.super_PlainObjectBase<Eigen::Matrix<float,_64,_64,_0,_64,_64>_>.m_storage.m_data.array[1] =
       R42_B.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[0] *
       R41_B.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[2] -
       R41_B.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[0] *
       R42_B.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[2];
  Action.super_PlainObjectBase<Eigen::Matrix<float,_64,_64,_0,_64,_64>_>.m_storage.m_data.array[0] =
       R42_B.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[2] *
       R41_B.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[1] -
       R41_B.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[2] *
       R42_B.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[1];
  Eigen::CommaInitializer<Eigen::Matrix<float,6,1,0,6,1>>::operator_
            ((CommaInitializer<Eigen::Matrix<float,6,1,0,6,1>> *)&Eig,
             (DenseBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_> *)&Action);
  Eigen::CommaInitializer<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>::finished
            ((CommaInitializer<Eigen::Matrix<float,_6,_1,_0,_6,_1>_> *)&Eig);
  Eigen::DenseBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>::head<int>
            ((Type *)&Eig,(DenseBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_> *)&L42,3);
  RVar18 = Eigen::MatrixBase<Eigen::Block<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_-1,_1,_false>_>::norm
                     ((MatrixBase<Eigen::Block<Eigen::Matrix<float,_6,_1,_0,_6,_1>,__1,_1,_false>_>
                       *)&Eig);
  EV.super_PlainObjectBase<Eigen::Matrix<std::complex<float>,_64,_64,_0,_64,_64>_>.m_storage.m_data.
  array[0]._M_value._0_4_ = RVar18;
  Eigen::DenseBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>::operator/=
            ((DenseBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_> *)&L42,(Scalar *)&EV);
  EV.super_PlainObjectBase<Eigen::Matrix<std::complex<float>,_64,_64,_0,_64,_64>_>.m_storage.m_data.
  array[0]._M_value = (_ComplexT)&Q52;
  EV.super_PlainObjectBase<Eigen::Matrix<std::complex<float>,_64,_64,_0,_64,_64>_>.m_storage.m_data.
  array[1]._M_value = (_ComplexT)&Q51;
  Eigen::CommaInitializer<Eigen::Matrix<float,6,1,0,6,1>>::
  CommaInitializer<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<float,float>,Eigen::Matrix<float,3,1,0,3,1>const,Eigen::Matrix<float,3,1,0,3,1>const>>
            ((CommaInitializer<Eigen::Matrix<float,6,1,0,6,1>> *)&Eig,&L51,
             (DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<float,_float>,_const_Eigen::Matrix<float,_3,_1,_0,_3,_1>,_const_Eigen::Matrix<float,_3,_1,_0,_3,_1>_>_>
              *)&EV);
  Action.super_PlainObjectBase<Eigen::Matrix<float,_64,_64,_0,_64,_64>_>.m_storage.m_data.array[2] =
       Q51.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[0] *
       Q52.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[1] -
       Q52.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[0] *
       Q51.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[1];
  Action.super_PlainObjectBase<Eigen::Matrix<float,_64,_64,_0,_64,_64>_>.m_storage.m_data.array[1] =
       Q52.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[0] *
       Q51.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[2] -
       Q51.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[0] *
       Q52.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[2];
  Action.super_PlainObjectBase<Eigen::Matrix<float,_64,_64,_0,_64,_64>_>.m_storage.m_data.array[0] =
       Q52.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[2] *
       Q51.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[1] -
       Q51.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[2] *
       Q52.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[1];
  Eigen::CommaInitializer<Eigen::Matrix<float,6,1,0,6,1>>::operator_
            ((CommaInitializer<Eigen::Matrix<float,6,1,0,6,1>> *)&Eig,
             (DenseBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_> *)&Action);
  Eigen::CommaInitializer<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>::finished
            ((CommaInitializer<Eigen::Matrix<float,_6,_1,_0,_6,_1>_> *)&Eig);
  Eigen::DenseBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>::head<int>
            ((Type *)&Eig,(DenseBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_> *)&L51,3);
  RVar18 = Eigen::MatrixBase<Eigen::Block<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_-1,_1,_false>_>::norm
                     ((MatrixBase<Eigen::Block<Eigen::Matrix<float,_6,_1,_0,_6,_1>,__1,_1,_false>_>
                       *)&Eig);
  EV.super_PlainObjectBase<Eigen::Matrix<std::complex<float>,_64,_64,_0,_64,_64>_>.m_storage.m_data.
  array[0]._M_value._0_4_ = RVar18;
  Eigen::DenseBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>::operator/=
            ((DenseBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_> *)&L51,(Scalar *)&EV);
  EV.super_PlainObjectBase<Eigen::Matrix<std::complex<float>,_64,_64,_0,_64,_64>_>.m_storage.m_data.
  array[0]._M_value = (_ComplexT)&R52_B;
  EV.super_PlainObjectBase<Eigen::Matrix<std::complex<float>,_64,_64,_0,_64,_64>_>.m_storage.m_data.
  array[1]._M_value = (_ComplexT)&R51_B;
  Eigen::CommaInitializer<Eigen::Matrix<float,6,1,0,6,1>>::
  CommaInitializer<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<float,float>,Eigen::Matrix<float,3,1,0,3,1>const,Eigen::Matrix<float,3,1,0,3,1>const>>
            ((CommaInitializer<Eigen::Matrix<float,6,1,0,6,1>> *)&Eig,&L52,
             (DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<float,_float>,_const_Eigen::Matrix<float,_3,_1,_0,_3,_1>,_const_Eigen::Matrix<float,_3,_1,_0,_3,_1>_>_>
              *)&EV);
  Action.super_PlainObjectBase<Eigen::Matrix<float,_64,_64,_0,_64,_64>_>.m_storage.m_data.array[2] =
       R51_B.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[0] *
       R52_B.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[1] -
       R52_B.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[0] *
       R51_B.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[1];
  Action.super_PlainObjectBase<Eigen::Matrix<float,_64,_64,_0,_64,_64>_>.m_storage.m_data.array[1] =
       R52_B.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[0] *
       R51_B.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[2] -
       R51_B.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[0] *
       R52_B.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[2];
  Action.super_PlainObjectBase<Eigen::Matrix<float,_64,_64,_0,_64,_64>_>.m_storage.m_data.array[0] =
       R52_B.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[2] *
       R51_B.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[1] -
       R51_B.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[2] *
       R52_B.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[1];
  Eigen::CommaInitializer<Eigen::Matrix<float,6,1,0,6,1>>::operator_
            ((CommaInitializer<Eigen::Matrix<float,6,1,0,6,1>> *)&Eig,
             (DenseBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_> *)&Action);
  Eigen::CommaInitializer<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>::finished
            ((CommaInitializer<Eigen::Matrix<float,_6,_1,_0,_6,_1>_> *)&Eig);
  Eigen::DenseBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>::head<int>
            ((Type *)&Eig,(DenseBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_> *)&L52,3);
  RVar18 = Eigen::MatrixBase<Eigen::Block<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_-1,_1,_false>_>::norm
                     ((MatrixBase<Eigen::Block<Eigen::Matrix<float,_6,_1,_0,_6,_1>,__1,_1,_false>_>
                       *)&Eig);
  EV.super_PlainObjectBase<Eigen::Matrix<std::complex<float>,_64,_64,_0,_64,_64>_>.m_storage.m_data.
  array[0]._M_value._0_4_ = RVar18;
  Eigen::DenseBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>::operator/=
            ((DenseBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_> *)&L52,(Scalar *)&EV);
  EV.super_PlainObjectBase<Eigen::Matrix<std::complex<float>,_64,_64,_0,_64,_64>_>.m_storage.m_data.
  array[0]._M_value = (_ComplexT)&Q62;
  EV.super_PlainObjectBase<Eigen::Matrix<std::complex<float>,_64,_64,_0,_64,_64>_>.m_storage.m_data.
  array[1]._M_value = (_ComplexT)&Q61;
  Eigen::CommaInitializer<Eigen::Matrix<float,6,1,0,6,1>>::
  CommaInitializer<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<float,float>,Eigen::Matrix<float,3,1,0,3,1>const,Eigen::Matrix<float,3,1,0,3,1>const>>
            ((CommaInitializer<Eigen::Matrix<float,6,1,0,6,1>> *)&Eig,&L61,
             (DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<float,_float>,_const_Eigen::Matrix<float,_3,_1,_0,_3,_1>,_const_Eigen::Matrix<float,_3,_1,_0,_3,_1>_>_>
              *)&EV);
  Action.super_PlainObjectBase<Eigen::Matrix<float,_64,_64,_0,_64,_64>_>.m_storage.m_data.array[2] =
       Q61.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[0] *
       Q62.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[1] -
       Q62.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[0] *
       Q61.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[1];
  Action.super_PlainObjectBase<Eigen::Matrix<float,_64,_64,_0,_64,_64>_>.m_storage.m_data.array[1] =
       Q62.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[0] *
       Q61.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[2] -
       Q61.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[0] *
       Q62.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[2];
  Action.super_PlainObjectBase<Eigen::Matrix<float,_64,_64,_0,_64,_64>_>.m_storage.m_data.array[0] =
       Q62.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[2] *
       Q61.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[1] -
       Q61.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[2] *
       Q62.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[1];
  Eigen::CommaInitializer<Eigen::Matrix<float,6,1,0,6,1>>::operator_
            ((CommaInitializer<Eigen::Matrix<float,6,1,0,6,1>> *)&Eig,
             (DenseBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_> *)&Action);
  Eigen::CommaInitializer<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>::finished
            ((CommaInitializer<Eigen::Matrix<float,_6,_1,_0,_6,_1>_> *)&Eig);
  Eigen::DenseBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>::head<int>
            ((Type *)&Eig,(DenseBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_> *)&L61,3);
  RVar18 = Eigen::MatrixBase<Eigen::Block<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_-1,_1,_false>_>::norm
                     ((MatrixBase<Eigen::Block<Eigen::Matrix<float,_6,_1,_0,_6,_1>,__1,_1,_false>_>
                       *)&Eig);
  EV.super_PlainObjectBase<Eigen::Matrix<std::complex<float>,_64,_64,_0,_64,_64>_>.m_storage.m_data.
  array[0]._M_value._0_4_ = RVar18;
  Eigen::DenseBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>::operator/=
            ((DenseBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_> *)&L61,(Scalar *)&EV);
  EV.super_PlainObjectBase<Eigen::Matrix<std::complex<float>,_64,_64,_0,_64,_64>_>.m_storage.m_data.
  array[1]._M_value = (_ComplexT)&R61_B;
  EV.super_PlainObjectBase<Eigen::Matrix<std::complex<float>,_64,_64,_0,_64,_64>_>.m_storage.m_data.
  array[0]._M_value = (_ComplexT)&R62_B;
  Eigen::CommaInitializer<Eigen::Matrix<float,6,1,0,6,1>>::
  CommaInitializer<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<float,float>,Eigen::Matrix<float,3,1,0,3,1>const,Eigen::Matrix<float,3,1,0,3,1>const>>
            ((CommaInitializer<Eigen::Matrix<float,6,1,0,6,1>> *)&Eig,&L62,
             (DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<float,_float>,_const_Eigen::Matrix<float,_3,_1,_0,_3,_1>,_const_Eigen::Matrix<float,_3,_1,_0,_3,_1>_>_>
              *)&EV);
  Action.super_PlainObjectBase<Eigen::Matrix<float,_64,_64,_0,_64,_64>_>.m_storage.m_data.array[2] =
       R61_B.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[0] *
       R62_B.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[1] -
       R62_B.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[0] *
       R61_B.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[1];
  Action.super_PlainObjectBase<Eigen::Matrix<float,_64,_64,_0,_64,_64>_>.m_storage.m_data.array[1] =
       R62_B.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[0] *
       R61_B.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[2] -
       R61_B.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[0] *
       R62_B.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[2];
  Action.super_PlainObjectBase<Eigen::Matrix<float,_64,_64,_0,_64,_64>_>.m_storage.m_data.array[0] =
       R62_B.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[2] *
       R61_B.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[1] -
       R61_B.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[2] *
       R62_B.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[1];
  Eigen::CommaInitializer<Eigen::Matrix<float,6,1,0,6,1>>::operator_
            ((CommaInitializer<Eigen::Matrix<float,6,1,0,6,1>> *)&Eig,
             (DenseBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_> *)&Action);
  Eigen::CommaInitializer<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>::finished
            ((CommaInitializer<Eigen::Matrix<float,_6,_1,_0,_6,_1>_> *)&Eig);
  Eigen::DenseBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>::head<int>
            ((Type *)&Eig,(DenseBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_> *)&L62,3);
  RVar18 = Eigen::MatrixBase<Eigen::Block<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_-1,_1,_false>_>::norm
                     ((MatrixBase<Eigen::Block<Eigen::Matrix<float,_6,_1,_0,_6,_1>,__1,_1,_false>_>
                       *)&Eig);
  EV.super_PlainObjectBase<Eigen::Matrix<std::complex<float>,_64,_64,_0,_64,_64>_>.m_storage.m_data.
  array[0]._M_value._0_4_ = RVar18;
  Eigen::DenseBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>::operator/=
            ((DenseBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_> *)&L62,(Scalar *)&EV);
  Eigen::internal::BlockImpl_dense<Eigen::Matrix<float,_6,_6,_0,_6,_6>,_6,_1,_true,_true>::
  BlockImpl_dense((BlockImpl_dense<Eigen::Matrix<float,_6,_6,_0,_6,_6>,_6,_1,_true,_true> *)&Eig,&L2
                  ,0);
  Eigen::internal::
  call_assignment<Eigen::Block<Eigen::Matrix<float,6,6,0,6,6>,6,1,true>,Eigen::Matrix<float,6,1,0,6,1>>
            ((Block<Eigen::Matrix<float,_6,_6,_0,_6,_6>,_6,_1,_true> *)&Eig,&L11);
  Eigen::internal::BlockImpl_dense<Eigen::Matrix<float,_6,_6,_0,_6,_6>,_6,_1,_true,_true>::
  BlockImpl_dense((BlockImpl_dense<Eigen::Matrix<float,_6,_6,_0,_6,_6>,_6,_1,_true,_true> *)&Eig,&L1
                  ,0);
  Eigen::internal::
  call_assignment<Eigen::Block<Eigen::Matrix<float,6,6,0,6,6>,6,1,true>,Eigen::Matrix<float,6,1,0,6,1>>
            ((Block<Eigen::Matrix<float,_6,_6,_0,_6,_6>,_6,_1,_true> *)&Eig,&L12);
  Eigen::internal::BlockImpl_dense<Eigen::Matrix<float,_6,_6,_0,_6,_6>,_6,_1,_true,_true>::
  BlockImpl_dense((BlockImpl_dense<Eigen::Matrix<float,_6,_6,_0,_6,_6>,_6,_1,_true,_true> *)&Eig,&L2
                  ,1);
  Eigen::internal::
  call_assignment<Eigen::Block<Eigen::Matrix<float,6,6,0,6,6>,6,1,true>,Eigen::Matrix<float,6,1,0,6,1>>
            ((Block<Eigen::Matrix<float,_6,_6,_0,_6,_6>,_6,_1,_true> *)&Eig,&L21);
  Eigen::internal::BlockImpl_dense<Eigen::Matrix<float,_6,_6,_0,_6,_6>,_6,_1,_true,_true>::
  BlockImpl_dense((BlockImpl_dense<Eigen::Matrix<float,_6,_6,_0,_6,_6>,_6,_1,_true,_true> *)&Eig,&L1
                  ,1);
  Eigen::internal::
  call_assignment<Eigen::Block<Eigen::Matrix<float,6,6,0,6,6>,6,1,true>,Eigen::Matrix<float,6,1,0,6,1>>
            ((Block<Eigen::Matrix<float,_6,_6,_0,_6,_6>,_6,_1,_true> *)&Eig,&L22);
  Eigen::internal::BlockImpl_dense<Eigen::Matrix<float,_6,_6,_0,_6,_6>,_6,_1,_true,_true>::
  BlockImpl_dense((BlockImpl_dense<Eigen::Matrix<float,_6,_6,_0,_6,_6>,_6,_1,_true,_true> *)&Eig,&L2
                  ,2);
  Eigen::internal::
  call_assignment<Eigen::Block<Eigen::Matrix<float,6,6,0,6,6>,6,1,true>,Eigen::Matrix<float,6,1,0,6,1>>
            ((Block<Eigen::Matrix<float,_6,_6,_0,_6,_6>,_6,_1,_true> *)&Eig,&L31);
  Eigen::internal::BlockImpl_dense<Eigen::Matrix<float,_6,_6,_0,_6,_6>,_6,_1,_true,_true>::
  BlockImpl_dense((BlockImpl_dense<Eigen::Matrix<float,_6,_6,_0,_6,_6>,_6,_1,_true,_true> *)&Eig,&L1
                  ,2);
  Eigen::internal::
  call_assignment<Eigen::Block<Eigen::Matrix<float,6,6,0,6,6>,6,1,true>,Eigen::Matrix<float,6,1,0,6,1>>
            ((Block<Eigen::Matrix<float,_6,_6,_0,_6,_6>,_6,_1,_true> *)&Eig,&L32);
  Eigen::internal::BlockImpl_dense<Eigen::Matrix<float,_6,_6,_0,_6,_6>,_6,_1,_true,_true>::
  BlockImpl_dense((BlockImpl_dense<Eigen::Matrix<float,_6,_6,_0,_6,_6>,_6,_1,_true,_true> *)&Eig,&L2
                  ,3);
  Eigen::internal::
  call_assignment<Eigen::Block<Eigen::Matrix<float,6,6,0,6,6>,6,1,true>,Eigen::Matrix<float,6,1,0,6,1>>
            ((Block<Eigen::Matrix<float,_6,_6,_0,_6,_6>,_6,_1,_true> *)&Eig,&L41);
  Eigen::internal::BlockImpl_dense<Eigen::Matrix<float,_6,_6,_0,_6,_6>,_6,_1,_true,_true>::
  BlockImpl_dense((BlockImpl_dense<Eigen::Matrix<float,_6,_6,_0,_6,_6>,_6,_1,_true,_true> *)&Eig,&L1
                  ,3);
  Eigen::internal::
  call_assignment<Eigen::Block<Eigen::Matrix<float,6,6,0,6,6>,6,1,true>,Eigen::Matrix<float,6,1,0,6,1>>
            ((Block<Eigen::Matrix<float,_6,_6,_0,_6,_6>,_6,_1,_true> *)&Eig,&L42);
  Eigen::internal::BlockImpl_dense<Eigen::Matrix<float,_6,_6,_0,_6,_6>,_6,_1,_true,_true>::
  BlockImpl_dense((BlockImpl_dense<Eigen::Matrix<float,_6,_6,_0,_6,_6>,_6,_1,_true,_true> *)&Eig,&L2
                  ,4);
  Eigen::internal::
  call_assignment<Eigen::Block<Eigen::Matrix<float,6,6,0,6,6>,6,1,true>,Eigen::Matrix<float,6,1,0,6,1>>
            ((Block<Eigen::Matrix<float,_6,_6,_0,_6,_6>,_6,_1,_true> *)&Eig,&L51);
  Eigen::internal::BlockImpl_dense<Eigen::Matrix<float,_6,_6,_0,_6,_6>,_6,_1,_true,_true>::
  BlockImpl_dense((BlockImpl_dense<Eigen::Matrix<float,_6,_6,_0,_6,_6>,_6,_1,_true,_true> *)&Eig,&L1
                  ,4);
  Eigen::internal::
  call_assignment<Eigen::Block<Eigen::Matrix<float,6,6,0,6,6>,6,1,true>,Eigen::Matrix<float,6,1,0,6,1>>
            ((Block<Eigen::Matrix<float,_6,_6,_0,_6,_6>,_6,_1,_true> *)&Eig,&L52);
  Eigen::internal::BlockImpl_dense<Eigen::Matrix<float,_6,_6,_0,_6,_6>,_6,_1,_true,_true>::
  BlockImpl_dense((BlockImpl_dense<Eigen::Matrix<float,_6,_6,_0,_6,_6>,_6,_1,_true,_true> *)&Eig,&L2
                  ,5);
  Eigen::internal::
  call_assignment<Eigen::Block<Eigen::Matrix<float,6,6,0,6,6>,6,1,true>,Eigen::Matrix<float,6,1,0,6,1>>
            ((Block<Eigen::Matrix<float,_6,_6,_0,_6,_6>,_6,_1,_true> *)&Eig,&L61);
  Eigen::internal::BlockImpl_dense<Eigen::Matrix<float,_6,_6,_0,_6,_6>,_6,_1,_true,_true>::
  BlockImpl_dense((BlockImpl_dense<Eigen::Matrix<float,_6,_6,_0,_6,_6>,_6,_1,_true,_true> *)&Eig,&L1
                  ,5);
  Eigen::internal::
  call_assignment<Eigen::Block<Eigen::Matrix<float,6,6,0,6,6>,6,1,true>,Eigen::Matrix<float,6,1,0,6,1>>
            ((Block<Eigen::Matrix<float,_6,_6,_0,_6,_6>,_6,_1,_true> *)&Eig,&L62);
  L1vec.
  super__Vector_base<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_Eigen::aligned_allocator<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  L1vec.
  super__Vector_base<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_Eigen::aligned_allocator<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  L1vec.
  super__Vector_base<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_Eigen::aligned_allocator<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  L2vec.
  super__Vector_base<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_Eigen::aligned_allocator<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  L2vec.
  super__Vector_base<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_Eigen::aligned_allocator<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  L2vec.
  super__Vector_base<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_Eigen::aligned_allocator<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  for (lVar15 = 0; lVar15 != 6; lVar15 = lVar15 + 1) {
    Eigen::Block<Eigen::Matrix<float,_6,_6,_0,_6,_6>,_6,_1,_true>::Block
              ((Block<Eigen::Matrix<float,_6,_6,_0,_6,_6>,_6,_1,_true> *)&Eig,&L1,lVar15);
    Eigen::PlainObjectBase<Eigen::Matrix<float,6,1,0,6,1>>::
    PlainObjectBase<Eigen::Block<Eigen::Matrix<float,6,6,0,6,6>,6,1,true>>
              ((PlainObjectBase<Eigen::Matrix<float,6,1,0,6,1>> *)&EV,
               (DenseBase<Eigen::Block<Eigen::Matrix<float,_6,_6,_0,_6,_6>,_6,_1,_true>_> *)&Eig);
    std::
    vector<Eigen::Matrix<float,6,1,0,6,1>,Eigen::aligned_allocator<Eigen::Matrix<float,6,1,0,6,1>>>
    ::emplace_back<Eigen::Matrix<float,6,1,0,6,1>>
              ((vector<Eigen::Matrix<float,6,1,0,6,1>,Eigen::aligned_allocator<Eigen::Matrix<float,6,1,0,6,1>>>
                *)&L1vec,(Matrix<float,_6,_1,_0,_6,_1> *)&EV);
    Eigen::Block<Eigen::Matrix<float,_6,_6,_0,_6,_6>,_6,_1,_true>::Block
              ((Block<Eigen::Matrix<float,_6,_6,_0,_6,_6>,_6,_1,_true> *)&Eig,&L2,lVar15);
    Eigen::PlainObjectBase<Eigen::Matrix<float,6,1,0,6,1>>::
    PlainObjectBase<Eigen::Block<Eigen::Matrix<float,6,6,0,6,6>,6,1,true>>
              ((PlainObjectBase<Eigen::Matrix<float,6,1,0,6,1>> *)&EV,
               (DenseBase<Eigen::Block<Eigen::Matrix<float,_6,_6,_0,_6,_6>,_6,_1,_true>_> *)&Eig);
    std::
    vector<Eigen::Matrix<float,6,1,0,6,1>,Eigen::aligned_allocator<Eigen::Matrix<float,6,1,0,6,1>>>
    ::emplace_back<Eigen::Matrix<float,6,1,0,6,1>>
              ((vector<Eigen::Matrix<float,6,1,0,6,1>,Eigen::aligned_allocator<Eigen::Matrix<float,6,1,0,6,1>>>
                *)&L2vec,(Matrix<float,_6,_1,_0,_6,_1> *)&EV);
  }
  Eigen::DenseBase<Eigen::Matrix<float,_64,_64,_0,_64,_64>_>::Zero();
  Eigen::PlainObjectBase<Eigen::Matrix<float,64,64,0,64,64>>::
  _set_noalias<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>,Eigen::Matrix<float,64,64,0,64,64>>>
            ((PlainObjectBase<Eigen::Matrix<float,64,64,0,64,64>> *)&Action,
             (DenseBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>,_Eigen::Matrix<float,_64,_64,_0,_64,_64>_>_>
              *)&Eig);
  setupAction<float>(&L1vec,&L2vec,&Action);
  Eigen::MatrixBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>::Identity((IdentityReturnType *)&Eig,4,4);
  Eigen::PlainObjectBase<Eigen::Matrix<float,4,4,0,4,4>>::
  _set_noalias<Eigen::CwiseNullaryOp<Eigen::internal::scalar_identity_op<float>,Eigen::Matrix<float,4,4,0,4,4>>>
            ((PlainObjectBase<Eigen::Matrix<float,4,4,0,4,4>> *)&TransformationEstimate,
             (DenseBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_identity_op<float>,_Eigen::Matrix<float,_4,_4,_0,_4,_4>_>_>
              *)&Eig);
  Eigen::EigenSolver<Eigen::Matrix<float,64,64,0,64,64>>::
  EigenSolver<Eigen::Matrix<float,64,64,0,64,64>>
            ((EigenSolver<Eigen::Matrix<float,64,64,0,64,64>> *)&Eig,
             (EigenBase<Eigen::Matrix<float,_64,_64,_0,_64,_64>_> *)&Action,true);
  Eigen::EigenSolver<Eigen::Matrix<float,_64,_64,_0,_64,_64>_>::eigenvectors(&EV,&Eig);
  std::
  vector<Eigen::Matrix<float,_4,_4,_0,_4,_4>,_std::allocator<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>_>
  ::reserve(__return_storage_ptr__,0x40);
  for (lVar15 = 0; lVar15 != 0x40; lVar15 = lVar15 + 1) {
    index = 0;
    lVar11 = 3;
    bVar14 = false;
    while (bVar16 = lVar11 != 0, lVar11 = lVar11 + -1, bVar16) {
      __x = Eigen::DenseCoeffsBase<Eigen::Matrix<std::complex<float>,_64,_64,_0,_64,_64>,_1>::
            operator()((DenseCoeffsBase<Eigen::Matrix<std::complex<float>,_64,_64,_0,_64,_64>,_1> *)
                       &EV,index | 0x3c,lVar15);
      __y = Eigen::DenseCoeffsBase<Eigen::Matrix<std::complex<float>,_64,_64,_0,_64,_64>,_1>::
            operator()((DenseCoeffsBase<Eigen::Matrix<std::complex<float>,_64,_64,_0,_64,_64>,_1> *)
                       &EV,0x3f,lVar15);
      std::operator/(__x,__y);
      pSVar7 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>,_1>::operator[]
                         ((DenseCoeffsBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>,_1> *)&solution,index
                         );
      *pSVar7 = extraout_XMM0_Da;
      pSVar7 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>,_1>::operator[]
                         ((DenseCoeffsBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>,_1> *)&solution,index
                         );
      bVar14 = (bool)(NAN(*pSVar7) | bVar14 | 1e-06 <= ABS(extraout_XMM0_Db));
      index = index + 1;
    }
    if (!bVar14) {
      cayley2rot<float>((Matrix<float,_3,_3,_0,_3,_3> *)auStack_20998,&solution);
      aTStack_20b30[0].
      super_Block<Eigen::Block<Eigen::Matrix<float,_6,_6,_0,_6,_6>,_6,_1,_true>,__1,_1,_false>.
      super_BlockImpl<Eigen::Block<Eigen::Matrix<float,_6,_6,_0,_6,_6>,_6,_1,_true>,__1,_1,_false,_Eigen::Dense>
      .
      super_BlockImpl_dense<Eigen::Block<Eigen::Matrix<float,_6,_6,_0,_6,_6>,_6,_1,_true>,__1,_1,_false,_true>
      .
      super_MapBase<Eigen::Block<Eigen::Block<Eigen::Matrix<float,_6,_6,_0,_6,_6>,_6,_1,_true>,__1,_1,_false>,_1>
      .
      super_MapBase<Eigen::Block<Eigen::Block<Eigen::Matrix<float,_6,_6,_0,_6,_6>,_6,_1,_true>,__1,_1,_false>,_0>
      .m_data = (PointerType)auStack_20998;
      Eigen::internal::
      call_assignment<Eigen::Matrix<float,3,3,0,3,3>,Eigen::Transpose<Eigen::Matrix<float,3,3,0,3,3>>>
                (&RotationEstimate,(Transpose<Eigen::Matrix<float,_3,_3,_0,_3,_3>_> *)aTStack_20b30)
      ;
      for (lVar11 = 0; lVar11 != 6; lVar11 = lVar11 + 1) {
        Eigen::Block<Eigen::Matrix<float,_6,_6,_0,_6,_6>,_6,_1,_true>::Block
                  (&BStack_20ea8,&L1,lVar11);
        Eigen::DenseBase<Eigen::Block<Eigen::Matrix<float,_6,_6,_0,_6,_6>,_6,_1,_true>_>::tail<int>
                  (&TStack_20d28,
                   (DenseBase<Eigen::Block<Eigen::Matrix<float,_6,_6,_0,_6,_6>,_6,_1,_true>_> *)
                   &BStack_20ea8,3);
        pTVar12 = &TStack_20d28;
        pLVar13 = &LStack_20790;
        for (lVar10 = 0xc; lVar10 != 0; lVar10 = lVar10 + -1) {
          (pLVar13->m_matrix).
          super_BlockImpl<Eigen::Block<Eigen::Matrix<float,_6,_6,_0,_6,_6>,_6,_1,_true>,__1,_1,_false,_Eigen::Dense>
          .
          super_BlockImpl_dense<Eigen::Block<Eigen::Matrix<float,_6,_6,_0,_6,_6>,_6,_1,_true>,__1,_1,_false,_true>
          .
          super_MapBase<Eigen::Block<Eigen::Block<Eigen::Matrix<float,_6,_6,_0,_6,_6>,_6,_1,_true>,__1,_1,_false>,_1>
          .
          super_MapBase<Eigen::Block<Eigen::Block<Eigen::Matrix<float,_6,_6,_0,_6,_6>,_6,_1,_true>,__1,_1,_false>,_0>
          .m_data = (pTVar12->
                    super_Block<Eigen::Block<Eigen::Matrix<float,_6,_6,_0,_6,_6>,_6,_1,_true>,__1,_1,_false>
                    ).
                    super_BlockImpl<Eigen::Block<Eigen::Matrix<float,_6,_6,_0,_6,_6>,_6,_1,_true>,__1,_1,_false,_Eigen::Dense>
                    .
                    super_BlockImpl_dense<Eigen::Block<Eigen::Matrix<float,_6,_6,_0,_6,_6>,_6,_1,_true>,__1,_1,_false,_true>
                    .
                    super_MapBase<Eigen::Block<Eigen::Block<Eigen::Matrix<float,_6,_6,_0,_6,_6>,_6,_1,_true>,__1,_1,_false>,_1>
                    .
                    super_MapBase<Eigen::Block<Eigen::Block<Eigen::Matrix<float,_6,_6,_0,_6,_6>,_6,_1,_true>,__1,_1,_false>,_0>
                    .m_data;
          pTVar12 = (Type *)((long)pTVar12 + ((ulong)bVar17 * -2 + 1) * 8);
          pLVar13 = (Lhs *)((long)pLVar13 + ((ulong)bVar17 * -2 + 1) * 8);
        }
        Eigen::
        Product<Eigen::Transpose<Eigen::Block<Eigen::Block<Eigen::Matrix<float,_6,_6,_0,_6,_6>,_6,_1,_true>,_-1,_1,_false>_>,_Eigen::Matrix<float,_3,_3,_0,_3,_3>,_0>
        ::Product(&PStack_20b98,&LStack_20790,&RotationEstimate);
        Eigen::Block<Eigen::Matrix<float,_6,_6,_0,_6,_6>,_6,_1,_true>::Block
                  (&BStack_20ed8,&L2,lVar11);
        Eigen::DenseBase<Eigen::Block<Eigen::Matrix<float,_6,_6,_0,_6,_6>,_6,_1,_true>_>::head<int>
                  (&TStack_20d88,
                   (DenseBase<Eigen::Block<Eigen::Matrix<float,_6,_6,_0,_6,_6>,_6,_1,_true>_> *)
                   &BStack_20ed8,3);
        Eigen::
        Product<Eigen::Product<Eigen::Transpose<Eigen::Block<Eigen::Block<Eigen::Matrix<float,_6,_6,_0,_6,_6>,_6,_1,_true>,_-1,_1,_false>_>,_Eigen::Matrix<float,_3,_3,_0,_3,_3>,_0>,_Eigen::Block<Eigen::Block<Eigen::Matrix<float,_6,_6,_0,_6,_6>,_6,_1,_true>,_-1,_1,_false>,_0>
        ::Product(&PStack_20cc8,&PStack_20b98,
                  &TStack_20d88.
                   super_Block<Eigen::Block<Eigen::Matrix<float,_6,_6,_0,_6,_6>,_6,_1,_true>,__1,_1,_false>
                 );
        Eigen::Block<Eigen::Matrix<float,_6,_6,_0,_6,_6>,_6,_1,_true>::Block
                  (&BStack_20f08,&L1,lVar11);
        Eigen::DenseBase<Eigen::Block<Eigen::Matrix<float,_6,_6,_0,_6,_6>,_6,_1,_true>_>::head<int>
                  (&TStack_20de8,
                   (DenseBase<Eigen::Block<Eigen::Matrix<float,_6,_6,_0,_6,_6>,_6,_1,_true>_> *)
                   &BStack_20f08,3);
        pTVar12 = &TStack_20de8;
        pLVar13 = &LStack_207f0;
        for (lVar10 = 0xc; lVar10 != 0; lVar10 = lVar10 + -1) {
          (pLVar13->m_matrix).
          super_BlockImpl<Eigen::Block<Eigen::Matrix<float,_6,_6,_0,_6,_6>,_6,_1,_true>,__1,_1,_false,_Eigen::Dense>
          .
          super_BlockImpl_dense<Eigen::Block<Eigen::Matrix<float,_6,_6,_0,_6,_6>,_6,_1,_true>,__1,_1,_false,_true>
          .
          super_MapBase<Eigen::Block<Eigen::Block<Eigen::Matrix<float,_6,_6,_0,_6,_6>,_6,_1,_true>,__1,_1,_false>,_1>
          .
          super_MapBase<Eigen::Block<Eigen::Block<Eigen::Matrix<float,_6,_6,_0,_6,_6>,_6,_1,_true>,__1,_1,_false>,_0>
          .m_data = (pTVar12->
                    super_Block<Eigen::Block<Eigen::Matrix<float,_6,_6,_0,_6,_6>,_6,_1,_true>,__1,_1,_false>
                    ).
                    super_BlockImpl<Eigen::Block<Eigen::Matrix<float,_6,_6,_0,_6,_6>,_6,_1,_true>,__1,_1,_false,_Eigen::Dense>
                    .
                    super_BlockImpl_dense<Eigen::Block<Eigen::Matrix<float,_6,_6,_0,_6,_6>,_6,_1,_true>,__1,_1,_false,_true>
                    .
                    super_MapBase<Eigen::Block<Eigen::Block<Eigen::Matrix<float,_6,_6,_0,_6,_6>,_6,_1,_true>,__1,_1,_false>,_1>
                    .
                    super_MapBase<Eigen::Block<Eigen::Block<Eigen::Matrix<float,_6,_6,_0,_6,_6>,_6,_1,_true>,__1,_1,_false>,_0>
                    .m_data;
          pTVar12 = (Type *)((long)pTVar12 + ((ulong)bVar17 * -2 + 1) * 8);
          pLVar13 = (Lhs *)((long)pLVar13 + ((ulong)bVar17 * -2 + 1) * 8);
        }
        Eigen::
        Product<Eigen::Transpose<Eigen::Block<Eigen::Block<Eigen::Matrix<float,_6,_6,_0,_6,_6>,_6,_1,_true>,_-1,_1,_false>_>,_Eigen::Matrix<float,_3,_3,_0,_3,_3>,_0>
        ::Product(&PStack_20c00,&LStack_207f0,&RotationEstimate);
        Eigen::Block<Eigen::Matrix<float,_6,_6,_0,_6,_6>,_6,_1,_true>::Block
                  (&BStack_20f38,&L2,lVar11);
        Eigen::DenseBase<Eigen::Block<Eigen::Matrix<float,_6,_6,_0,_6,_6>,_6,_1,_true>_>::tail<int>
                  (&TStack_20e48,
                   (DenseBase<Eigen::Block<Eigen::Matrix<float,_6,_6,_0,_6,_6>,_6,_1,_true>_> *)
                   &BStack_20f38,3);
        Eigen::
        Product<Eigen::Product<Eigen::Transpose<Eigen::Block<Eigen::Block<Eigen::Matrix<float,_6,_6,_0,_6,_6>,_6,_1,_true>,_-1,_1,_false>_>,_Eigen::Matrix<float,_3,_3,_0,_3,_3>,_0>,_Eigen::Block<Eigen::Block<Eigen::Matrix<float,_6,_6,_0,_6,_6>,_6,_1,_true>,_-1,_1,_false>,_0>
        ::Product(&PStack_20730,&PStack_20c00,
                  &TStack_20e48.
                   super_Block<Eigen::Block<Eigen::Matrix<float,_6,_6,_0,_6,_6>,_6,_1,_true>,__1,_1,_false>
                 );
        memcpy(aTStack_20b30,&PStack_20cc8,200);
        memcpy(auStack_20a68,&PStack_20730,200);
        memcpy(auStack_20998 + 8,aTStack_20b30,400);
        Eigen::Block<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_1,_1,_false>::Block
                  (&BStack_20e78,&k,lVar11);
        Eigen::internal::
        call_assignment<Eigen::Block<Eigen::Matrix<float,6,1,0,6,1>,1,1,false>,Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<float>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<float,float>,Eigen::Product<Eigen::Product<Eigen::Transpose<Eigen::Block<Eigen::Block<Eigen::Matrix<float,6,6,0,6,6>,6,1,true>,_1,1,false>>,Eigen::Matrix<float,3,3,0,3,3>,0>,Eigen::Block<Eigen::Block<Eigen::Matrix<float,6,6,0,6,6>,6,1,true>,_1,1,false>,0>const,Eigen::Product<Eigen::Product<Eigen::Transpose<Eigen::Block<Eigen::Block<Eigen::Matrix<float,6,6,0,6,6>,6,1,true>,_1,1,false>>,Eigen::Matrix<float,3,3,0,3,3>,0>,Eigen::Block<Eigen::Block<Eigen::Matrix<float,6,6,0,6,6>,6,1,true>,_1,1,false>,0>const>const>>
                  (&BStack_20e78,
                   (CwiseUnaryOp<Eigen::internal::scalar_opposite_op<float>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<float,_float>,_const_Eigen::Product<Eigen::Product<Eigen::Transpose<Eigen::Block<Eigen::Block<Eigen::Matrix<float,_6,_6,_0,_6,_6>,_6,_1,_true>,__1,_1,_false>_>,_Eigen::Matrix<float,_3,_3,_0,_3,_3>,_0>,_Eigen::Block<Eigen::Block<Eigen::Matrix<float,_6,_6,_0,_6,_6>,_6,_1,_true>,__1,_1,_false>,_0>,_const_Eigen::Product<Eigen::Product<Eigen::Transpose<Eigen::Block<Eigen::Block<Eigen::Matrix<float,_6,_6,_0,_6,_6>,_6,_1,_true>,__1,_1,_false>_>,_Eigen::Matrix<float,_3,_3,_0,_3,_3>,_0>,_Eigen::Block<Eigen::Block<Eigen::Matrix<float,_6,_6,_0,_6,_6>,_6,_1,_true>,__1,_1,_false>,_0>_>_>
                    *)auStack_20998);
        pSVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_6,_6,_0,_6,_6>,_1>::operator()
                           ((DenseCoeffsBase<Eigen::Matrix<float,_6,_6,_0,_6,_6>,_1> *)&L1,0,lVar11)
        ;
        fVar1 = *pSVar8;
        pSVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_6,_6,_0,_6,_6>,_1>::operator()
                           ((DenseCoeffsBase<Eigen::Matrix<float,_6,_6,_0,_6,_6>,_1> *)&L1,1,lVar11)
        ;
        fVar2 = *pSVar8;
        pSVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_6,_6,_0,_6,_6>,_1>::operator()
                           ((DenseCoeffsBase<Eigen::Matrix<float,_6,_6,_0,_6,_6>,_1> *)&L1,2,lVar11)
        ;
        fVar3 = *pSVar8;
        Eigen::Block<Eigen::Matrix<float,_6,_6,_0,_6,_6>,_6,_1,_true>::Block
                  ((Block<Eigen::Matrix<float,_6,_6,_0,_6,_6>,_6,_1,_true> *)&PStack_20cc8,&L2,
                   lVar11);
        Eigen::DenseBase<Eigen::Block<Eigen::Matrix<float,_6,_6,_0,_6,_6>,_6,_1,_true>_>::head<int>
                  (aTStack_20b30,
                   (DenseBase<Eigen::Block<Eigen::Matrix<float,_6,_6,_0,_6,_6>,_6,_1,_true>_> *)
                   &PStack_20cc8,3);
        Eigen::
        Product<Eigen::Matrix<float,_3,_3,_0,_3,_3>,_Eigen::Block<Eigen::Block<Eigen::Matrix<float,_6,_6,_0,_6,_6>,_6,_1,_true>,_-1,_1,_false>,_0>
        ::Product((Product<Eigen::Matrix<float,_3,_3,_0,_3,_3>,_Eigen::Block<Eigen::Block<Eigen::Matrix<float,_6,_6,_0,_6,_6>,_6,_1,_true>,__1,_1,_false>,_0>
                   *)auStack_20998,&RotationEstimate,
                  &aTStack_20b30[0].
                   super_Block<Eigen::Block<Eigen::Matrix<float,_6,_6,_0,_6,_6>,_6,_1,_true>,__1,_1,_false>
                 );
        Eigen::internal::
        call_assignment<Eigen::Matrix<float,3,1,0,3,1>,Eigen::Product<Eigen::Matrix<float,3,3,0,3,3>,Eigen::Block<Eigen::Block<Eigen::Matrix<float,6,6,0,6,6>,6,1,true>,_1,1,false>,0>>
                  (&eD2,(Product<Eigen::Matrix<float,_3,_3,_0,_3,_3>,_Eigen::Block<Eigen::Block<Eigen::Matrix<float,_6,_6,_0,_6,_6>,_6,_1,_true>,__1,_1,_false>,_0>
                         *)auStack_20998);
        fVar6 = eD2.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.m_data.
                array[2];
        fVar5 = eD2.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.m_data.
                array[1];
        fVar4 = eD2.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.m_data.
                array[0];
        pSVar9 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_6,_3,_0,_6,_3>,_1>::operator()
                           ((DenseCoeffsBase<Eigen::Matrix<float,_6,_3,_0,_6,_3>,_1> *)&A,lVar11,0);
        *pSVar9 = fVar3 * fVar5 - fVar6 * fVar2;
        pSVar9 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_6,_3,_0,_6,_3>,_1>::operator()
                           ((DenseCoeffsBase<Eigen::Matrix<float,_6,_3,_0,_6,_3>,_1> *)&A,lVar11,1);
        *pSVar9 = fVar6 * fVar1 - fVar3 * fVar4;
        pSVar9 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_6,_3,_0,_6,_3>,_1>::operator()
                           ((DenseCoeffsBase<Eigen::Matrix<float,_6,_3,_0,_6,_3>,_1> *)&A,lVar11,2);
        *pSVar9 = fVar2 * fVar4 - fVar5 * fVar1;
      }
      auStack_20998._0_8_ = &A;
      auStack_20998._24_8_ = &k;
      auStack_20998._8_8_ = auStack_20998._0_8_;
      auStack_20998._16_8_ = auStack_20998._0_8_;
      Eigen::internal::
      call_assignment<Eigen::Matrix<float,3,1,0,3,1>,Eigen::Product<Eigen::Product<Eigen::Inverse<Eigen::Product<Eigen::Transpose<Eigen::Matrix<float,6,3,0,6,3>>,Eigen::Matrix<float,6,3,0,6,3>,0>>,Eigen::Transpose<Eigen::Matrix<float,6,3,0,6,3>>,0>,Eigen::Matrix<float,6,1,0,6,1>,0>>
                (&TranslationEstimate,
                 (Product<Eigen::Product<Eigen::Inverse<Eigen::Product<Eigen::Transpose<Eigen::Matrix<float,_6,_3,_0,_6,_3>_>,_Eigen::Matrix<float,_6,_3,_0,_6,_3>,_0>_>,_Eigen::Transpose<Eigen::Matrix<float,_6,_3,_0,_6,_3>_>,_0>,_Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0>
                  *)auStack_20998);
      Eigen::DenseBase<Eigen::Matrix<float,4,4,0,4,4>>::topLeftCorner<int,int>
                ((Type *)auStack_20998,&TransformationEstimate,3,3);
      Eigen::internal::
      call_assignment<Eigen::Block<Eigen::Matrix<float,4,4,0,4,4>,_1,_1,false>,Eigen::Matrix<float,3,3,0,3,3>>
                ((Block<Eigen::Matrix<float,_4,_4,_0,_4,_4>,__1,__1,_false> *)auStack_20998,
                 &RotationEstimate);
      Eigen::DenseBase<Eigen::Matrix<float,4,4,0,4,4>>::topRightCorner<int,int>
                ((Type *)auStack_20998,&TransformationEstimate,3,1);
      Eigen::internal::
      call_assignment<Eigen::Block<Eigen::Matrix<float,4,4,0,4,4>,_1,_1,false>,Eigen::Matrix<float,3,1,0,3,1>>
                ((Block<Eigen::Matrix<float,_4,_4,_0,_4,_4>,__1,__1,_false> *)auStack_20998,
                 &TranslationEstimate);
      std::
      vector<Eigen::Matrix<float,_4,_4,_0,_4,_4>,_std::allocator<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>_>
      ::push_back(__return_storage_ptr__,&TransformationEstimate);
    }
  }
  free(L2vec.
       super__Vector_base<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_Eigen::aligned_allocator<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>_>
       ._M_impl.super__Vector_impl_data._M_start);
  free(L1vec.
       super__Vector_base<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_Eigen::aligned_allocator<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>_>
       ._M_impl.super__Vector_impl_data._M_start);
  return __return_storage_ptr__;
}

Assistant:

std::vector<Eigen::Matrix<floatPrec,4,4>> solver6L(
  std::vector<std::pair<Eigen::Matrix<floatPrec,4,1>, Eigen::Matrix<floatPrec,4,1>>> ptPair,
	std::vector<std::pair<Eigen::Matrix<floatPrec,4,1>, Eigen::Matrix<floatPrec,4,1>>> plPair,
	std::vector<std::pair<std::pair<Eigen::Matrix<floatPrec,4,1>, Eigen::Matrix<floatPrec,4,1>>,std::pair<Eigen::Matrix<floatPrec,4,1>, Eigen::Matrix<floatPrec,4,1>>>> lPair,
  std::vector<std::pair<std::pair<Eigen::Matrix<floatPrec,4,1>, Eigen::Matrix<floatPrec,4,1>>,std::pair<Eigen::Matrix<floatPrec,4,1>, Eigen::Matrix<floatPrec,4,1>>>> lCPair
  )
{

  std::vector<Eigen::Matrix<floatPrec,4,4>> solutions;

  // parse inputs
	Eigen::Matrix<floatPrec,3,1> Q11, Q12, R11_B, R12_B, Q21, Q22, R21_B, R22_B, 
  Q31, Q32, R31_B, R32_B, Q41, Q42, R41_B, R42_B, Q51, Q52, R51_B, R52_B, Q61, Q62, R61_B, R62_B;
	
	Q11   = lPair[0].first.first.head(3);  Q12   = lPair[0].first.second.head(3);
	R11_B = lPair[0].second.first.head(3); R12_B = lPair[0].second.second.head(3);
	Q21   = lPair[1].first.first.head(3);  Q22   = lPair[1].first.second.head(3);
	R21_B = lPair[1].second.first.head(3); R22_B = lPair[1].second.second.head(3);
	Q31   = lPair[2].first.first.head(3);  Q32   = lPair[2].first.second.head(3);
	R31_B = lPair[2].second.first.head(3); R32_B = lPair[2].second.second.head(3);
  Q41   = lPair[3].first.first.head(3);  Q42   = lPair[3].first.second.head(3);
	R41_B = lPair[3].second.first.head(3); R42_B = lPair[3].second.second.head(3);
	Q51   = lPair[4].first.first.head(3);  Q52   = lPair[4].first.second.head(3);
	R51_B = lPair[4].second.first.head(3); R52_B = lPair[4].second.second.head(3);
	Q61   = lPair[5].first.first.head(3);  Q62   = lPair[5].first.second.head(3);
	R61_B = lPair[5].second.first.head(3); R62_B = lPair[5].second.second.head(3);

  Eigen::Matrix<floatPrec,6,1> L11, L12, L21, L22, L31, L32;
  Eigen::Matrix<floatPrec,6,1> L41, L42, L51, L52, L61, L62;
  L11 << Q12 - Q11, Q11.cross(Q12); L11 /= L11.head(3).norm();
  L12 << R12_B - R11_B, R11_B.cross(R12_B); L12 /= L12.head(3).norm();
  L21 << Q22 - Q21, Q21.cross(Q22); L21 /= L21.head(3).norm();
  L22 << R22_B - R21_B, R21_B.cross(R22_B); L22 /= L22.head(3).norm();
  L31 << Q32 - Q31, Q31.cross(Q32); L31 /= L31.head(3).norm();
  L32 << R32_B - R31_B, R31_B.cross(R32_B); L32 /= L32.head(3).norm();
  L41 << Q42 - Q41, Q41.cross(Q42); L41 /= L41.head(3).norm();
  L42 << R42_B - R41_B, R41_B.cross(R42_B); L42 /= L42.head(3).norm();
  L51 << Q52 - Q51, Q51.cross(Q52); L51 /= L51.head(3).norm();
  L52 << R52_B - R51_B, R51_B.cross(R52_B); L52 /= L52.head(3).norm();
  L61 << Q62 - Q61, Q61.cross(Q62); L61 /= L61.head(3).norm();
  L62 << R62_B - R61_B, R61_B.cross(R62_B); L62 /= L62.head(3).norm();

  Eigen::Matrix<floatPrec,6,6> L1,L2,L3;
  L2.col(0) = L11; L1.col(0) = L12; 
  L2.col(1) = L21; L1.col(1) = L22;
  L2.col(2) = L31; L1.col(2) = L32;
  L2.col(3) = L41; L1.col(3) = L42;
  L2.col(4) = L51; L1.col(4) = L52;
  L2.col(5) = L61; L1.col(5) = L62;
  // L3 = L2;
  // L2 = L1;
  // L1 = L3;

  // std::cout << "Lines in solve6L" << std::endl;
  // std::cout << L1 << std::endl;
  // std::cout << std::endl <<  L2 << std::endl;
  
  //create vectors of Pluecker coordinates
  std::vector< Eigen::Matrix<floatPrec,6,1>, Eigen::aligned_allocator<Eigen::Matrix<floatPrec,6,1> > > L1vec;
  std::vector< Eigen::Matrix<floatPrec,6,1>, Eigen::aligned_allocator<Eigen::Matrix<floatPrec,6,1> > > L2vec;
  for(int i = 0; i < 6; i++ )
  {
    L1vec.push_back( L1.col(i) );
    L2vec.push_back( L2.col(i) );
  }
  
  //setup the action matrix
  Eigen::Matrix<floatPrec,64,64> Action = Eigen::Matrix<floatPrec,64,64>::Zero();
  setupAction<floatPrec>( L1vec, L2vec, Action );
  
  Eigen::Matrix<floatPrec, 6,3> A;
  Eigen::Matrix<floatPrec, 6,1> k;
  Eigen::Matrix<floatPrec, 3,1> eD2;
  Eigen::Matrix<floatPrec, 3,3> RotationEstimate;
  Eigen::Matrix<floatPrec, 3,1> TranslationEstimate;
  Eigen::Matrix<floatPrec, 4,4> TransformationEstimate = Eigen::Matrix<floatPrec, 4,4>::Identity(4,4);
  floatPrec d11, d12, d13, d21, d22, d23;

  
  //finally eigen-decompose the action-matrix and obtain the solutions
  Eigen::EigenSolver< Eigen::Matrix<floatPrec,64,64> > Eig(Action,true);
  Eigen::Matrix<std::complex<floatPrec>,64,64> EV = Eig.eigenvectors();
  
  bool isComplex = false;

  solutions.reserve(64);  
  for( int c = 0; c < 64; c++ )
  {
    Eigen::Matrix<floatPrec,3,1> solution;
    for( int r = 0; r < 3; r++ )
    {
      std::complex<floatPrec> temp = EV(60+r,c)/EV(63,c);
      solution[r] = temp.real(); // should we remove the complex solution????
      if(std::abs(temp.imag()) >= 0.000001 )
        isComplex = true;
      if(std::isnan(solution[r]))
        isComplex = true;
    }

    if(isComplex) isComplex = false; 
    else{
      RotationEstimate = cayley2rot<floatPrec>(solution).transpose();
      for (unsigned int iter = 0; iter < 6 ; iter++){
        k.row(iter) = -(L1.col(iter).tail(3).transpose() * RotationEstimate * L2.col(iter).head(3) +
                      L1.col(iter).head(3).transpose() * RotationEstimate * L2.col(iter).tail(3));

        d11 = L1(0,iter); d12 = L1(1,iter) ; d13 = L1(2,iter);
        eD2 = RotationEstimate*(L2.col(iter).head(3));
        d21 = eD2(0); d22 = eD2(1) ; d23 = eD2(2);

        A(iter,0) =  d13*d22 - d12*d23;
        A(iter,1) = -d13*d21 + d11*d23;
        A(iter,2) =  d12*d21 - d11*d22;
      }

      TranslationEstimate = (A.transpose()*A).inverse()*(A.transpose())*k;

      TransformationEstimate.topLeftCorner(3,3) = RotationEstimate;
      TransformationEstimate.topRightCorner(3,1) = TranslationEstimate;

      solutions.push_back(TransformationEstimate);
    } 
  
    // std::cout << std::endl << std::endl << "the number of solutions that comes out of here are: " << cayley2rot<floatPrec>(solution).transpose() << std::endl << std::endl;
  }


  return solutions;

}